

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O2

int32_t aeron::concurrent::logbuffer::ExclusiveTermAppender::handleEndOfLogCondition
                  (AtomicBuffer *termBuffer,int32_t termId,int32_t termOffset,HeaderWriter *header,
                  index_t termLength)

{
  undefined4 in_register_00000014;
  int32_t paddingLength;
  uint v;
  
  v = termLength - termOffset;
  if (v != 0 && termOffset <= termLength) {
    HeaderWriter::write(header,(int)termBuffer,(void *)CONCAT44(in_register_00000014,termOffset),
                        (ulong)v);
    AtomicBuffer::putUInt16(termBuffer,termOffset + 6,0);
    AtomicBuffer::putInt32Ordered(termBuffer,termOffset,v);
  }
  return -2;
}

Assistant:

inline static std::int32_t handleEndOfLogCondition(
        AtomicBuffer& termBuffer,
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        util::index_t termLength)
    {
        if (termOffset < termLength)
        {
            const std::int32_t paddingLength = termLength - termOffset;
            header.write(termBuffer, termOffset, paddingLength, termId);
            FrameDescriptor::frameType(termBuffer, termOffset, DataFrameHeader::HDR_TYPE_PAD);
            FrameDescriptor::frameLengthOrdered(termBuffer, termOffset, paddingLength);
        }

        return TERM_APPENDER_FAILED;
    }